

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_load_module_file(sexp ctx,char *file,sexp env)

{
  sexp psVar1;
  sexp in_RDX;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp path;
  sexp res;
  sexp in_stack_00000038;
  char *in_stack_00000040;
  sexp in_stack_00000048;
  sexp in_stack_00000050;
  sexp in_stack_00000068;
  sexp in_stack_00000070;
  sexp_sint_t in_stack_00000078;
  sexp in_stack_00000080;
  sexp in_stack_00000088;
  undefined1 *local_38;
  undefined8 local_30;
  char *file_00;
  sexp in_stack_ffffffffffffffe0;
  
  file_00 = &DAT_0000043e;
  memset(&local_38,0,0x10);
  local_38 = &stack0xffffffffffffffd8;
  local_30 = *(undefined8 *)(in_RDI + 0x6080);
  *(undefined1 ***)(in_RDI + 0x6080) = &local_38;
  psVar1 = sexp_find_module_file(in_stack_ffffffffffffffe0,file_00);
  if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 9)) {
    psVar1 = sexp_load_op(in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000070,
                          in_stack_00000068);
  }
  else {
    sexp_c_string(in_RDX,(char *)in_stack_ffffffffffffffe0,(sexp_sint_t)psVar1);
    psVar1 = sexp_user_exception(in_stack_00000050,in_stack_00000048,in_stack_00000040,
                                 in_stack_00000038);
  }
  *(undefined8 *)(in_RDI + 0x6080) = local_30;
  return psVar1;
}

Assistant:

sexp sexp_load_module_file (sexp ctx, const char *file, sexp env) {
  sexp res;
  sexp_gc_var1(path);
  sexp_gc_preserve1(ctx, path);
  path = sexp_find_module_file(ctx, file);
  if (sexp_stringp(path)) {
    res = sexp_load(ctx, path, env);
  } else {
    path = sexp_c_string(ctx, file, -1);
    res = sexp_user_exception(ctx, SEXP_FALSE, sexp_file_not_found, path);
  }
  sexp_gc_release1(ctx);
  return res;
}